

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

bool __thiscall
ON_Internal_ExtrudedEdge::SetSideGroupIdFromVertexPairs(ON_Internal_ExtrudedEdge *this)

{
  uint uVar1;
  ON_Internal_ExtrudedVertex *pOVar2;
  bool bVar3;
  uint evi;
  long lVar4;
  
  if (this->m_side_group_id == 0) {
    lVar4 = 0;
    do {
      if ((this->m_extruded_vertex[lVar4] != (ON_Internal_ExtrudedVertex *)0x0) &&
         (uVar1 = this->m_extruded_vertex[lVar4]->m_side_group_id, uVar1 != 0)) {
        this->m_side_group_id = uVar1;
        lVar4 = 0;
        bVar3 = false;
        do {
          pOVar2 = this->m_extruded_vertex[lVar4];
          if ((pOVar2 != (ON_Internal_ExtrudedVertex *)0x0) && (pOVar2->m_side_group_id == 0)) {
            pOVar2->m_side_group_id = uVar1;
            bVar3 = true;
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 == 1);
        return bVar3;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 == 1);
  }
  return false;
}

Assistant:

bool SetSideGroupIdFromVertexPairs()
  {
    if (m_side_group_id > 0)
      return false;
    for (unsigned evi = 0; evi < 2; ++evi)
    {
      if (nullptr != m_extruded_vertex[evi] && m_extruded_vertex[evi]->m_side_group_id > 0)
        return SetSideGroupId(m_extruded_vertex[evi]->m_side_group_id);
    }
    return false;
  }